

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::HashJoinLocalSourceState::HashJoinLocalSourceState
          (HashJoinLocalSourceState *this,PhysicalHashJoin *op,HashJoinGlobalSinkState *sink,
          Allocator *allocator)

{
  TupleDataChunkState *this_00;
  pointer pJVar1;
  type ht_p;
  type expr;
  JoinCondition *cond;
  pointer this_01;
  undefined1 local_68 [16];
  pointer local_58;
  LogicalType local_48;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__HashJoinLocalSourceState_017a2138;
  this->local_stage = INIT;
  LogicalType::LogicalType(&local_48,POINTER);
  Vector::Vector(&this->addresses,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  *(undefined4 *)&this->build_chunk_idx_from = 0xffffffff;
  *(undefined4 *)((long)&this->build_chunk_idx_from + 4) = 0xffffffff;
  *(undefined4 *)&this->build_chunk_idx_to = 0xffffffff;
  *(undefined4 *)((long)&this->build_chunk_idx_to + 4) = 0xffffffff;
  (this->probe_local_scan).allocator = (ColumnDataAllocator *)0x0;
  (this->probe_local_scan).current_chunk_state.handles._M_h._M_buckets =
       &(this->probe_local_scan).current_chunk_state.handles._M_h._M_single_bucket;
  (this->probe_local_scan).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->probe_local_scan).current_chunk_state.handles._M_h._M_before_begin = (_Hash_node_base *)0x0
  ;
  (this->probe_local_scan).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->probe_local_scan).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  *(undefined1 (*) [16])
   &(this->probe_local_scan).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->probe_local_scan).current_chunk_state.properties = INVALID;
  DataChunk::DataChunk(&this->lhs_probe_chunk);
  DataChunk::DataChunk(&this->lhs_join_keys);
  DataChunk::DataChunk(&this->lhs_output);
  this_00 = &this->join_key_state;
  TupleDataChunkState::TupleDataChunkState(this_00);
  ExpressionExecutor::ExpressionExecutor(&this->lhs_join_key_executor,sink->context);
  ht_p = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
         operator*(&sink->hash_table);
  JoinHashTable::ScanStructure::ScanStructure(&this->scan_structure,ht_p,this_00);
  JoinHashTable::ProbeState::ProbeState(&this->probe_state);
  this->empty_ht_probe_in_progress = false;
  *(undefined4 *)&this->full_outer_chunk_idx_from = 0xffffffff;
  *(undefined4 *)((long)&this->full_outer_chunk_idx_from + 4) = 0xffffffff;
  *(undefined4 *)&this->full_outer_chunk_idx_to = 0xffffffff;
  *(undefined4 *)((long)&this->full_outer_chunk_idx_to + 4) = 0xffffffff;
  (this->full_outer_scan_state).
  super_unique_ptr<duckdb::JoinHTScanState,_std::default_delete<duckdb::JoinHTScanState>_>._M_t.
  super___uniq_ptr_impl<duckdb::JoinHTScanState,_std::default_delete<duckdb::JoinHTScanState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::JoinHTScanState_*,_std::default_delete<duckdb::JoinHTScanState>_>.
  super__Head_base<0UL,_duckdb::JoinHTScanState_*,_false>._M_head_impl = (JoinHTScanState *)0x0;
  (this->probe_local_scan).current_chunk_state.properties = ALLOW_ZERO_COPY;
  DataChunk::Initialize(&this->lhs_probe_chunk,allocator,&sink->probe_types,0x800);
  DataChunk::Initialize(&this->lhs_join_keys,allocator,&op->condition_types,0x800);
  DataChunk::Initialize(&this->lhs_output,allocator,&(op->lhs_output_columns).col_types,0x800);
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  TupleDataCollection::InitializeChunkState
            (this_00,&op->condition_types,(vector<unsigned_long,_true> *)local_68);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  pJVar1 = (op->super_PhysicalComparisonJoin).conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (this_01 = (op->super_PhysicalComparisonJoin).conditions.
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_01 != pJVar1; this_01 = this_01 + 1)
  {
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&this_01->left);
    ExpressionExecutor::AddExpression(&this->lhs_join_key_executor,expr);
  }
  return;
}

Assistant:

HashJoinLocalSourceState::HashJoinLocalSourceState(const PhysicalHashJoin &op, const HashJoinGlobalSinkState &sink,
                                                   Allocator &allocator)
    : local_stage(HashJoinSourceStage::INIT), addresses(LogicalType::POINTER), lhs_join_key_executor(sink.context),
      scan_structure(*sink.hash_table, join_key_state) {
	auto &chunk_state = probe_local_scan.current_chunk_state;
	chunk_state.properties = ColumnDataScanProperties::ALLOW_ZERO_COPY;

	lhs_probe_chunk.Initialize(allocator, sink.probe_types);
	lhs_join_keys.Initialize(allocator, op.condition_types);
	lhs_output.Initialize(allocator, op.lhs_output_columns.col_types);
	TupleDataCollection::InitializeChunkState(join_key_state, op.condition_types);

	for (auto &cond : op.conditions) {
		lhs_join_key_executor.AddExpression(*cond.left);
	}
}